

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

BOOL MayHaveSideEffectOnNode
               (ParseNode *pnode,ParseNode *pnodeSE,ByteCodeGenerator *byteCodeGenerator)

{
  bool bVar1;
  uint uVar2;
  ParseNodeUni *pPVar3;
  ParseNode *this;
  ParseNodeBin *pPVar4;
  ParseNodeTri *pPVar5;
  ParseNodeCall *pPVar6;
  ParseNodeTri *pnodeTriSE;
  uint fnop;
  ParseNode *currPnodeSE;
  undefined1 local_48 [8];
  SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> pNodeSEStack;
  ArenaAllocator *alloc;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnodeSE_local;
  ParseNode *pnode_local;
  
  byteCodeGenerator_local = (ByteCodeGenerator *)pnodeSE;
  pnodeSE_local = pnode;
  if (pnode->nop == knopComputedName) {
    pPVar3 = ParseNode::AsParseNodeUni(pnode);
    pnodeSE_local = pPVar3->pnode1;
  }
  if (pnodeSE_local->nop == knopName) {
    pNodeSEStack.allocator = ByteCodeGenerator::GetAllocator(byteCodeGenerator);
    SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::SList
              ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48,
               pNodeSEStack.allocator);
    SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Push
              ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48,
               (ParseNode **)&byteCodeGenerator_local);
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              do {
                bVar1 = SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Empty
                                  ((SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                                   local_48);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  pnode_local._4_4_ = 0;
                  goto LAB_00b2a8dd;
                }
                this = SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Pop
                                 ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48)
                ;
                uVar2 = ParseNode::Grfnop((uint)this->nop);
              } while ((uVar2 & 2) != 0);
              if ((uVar2 & 0x20) != 0) {
                pnode_local._4_4_ = 1;
                goto LAB_00b2a8dd;
              }
              if ((uVar2 & 4) == 0) break;
              if ((this->nop != knopTempRef) &&
                 (pPVar3 = ParseNode::AsParseNodeUni(this), pPVar3->pnode1 != (ParseNodePtr)0x0)) {
                pPVar3 = ParseNode::AsParseNodeUni(this);
                SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Push
                          ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48,
                           &pPVar3->pnode1);
              }
            }
            if ((uVar2 & 8) == 0) break;
            pPVar4 = ParseNode::AsParseNodeBin(this);
            SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Push
                      ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48,
                       &pPVar4->pnode1);
            pPVar4 = ParseNode::AsParseNodeBin(this);
            if (pPVar4->pnode2 != (ParseNodePtr)0x0) {
              pPVar4 = ParseNode::AsParseNodeBin(this);
              SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Push
                        ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48,
                         &pPVar4->pnode2);
            }
          }
          if (this->nop != knopQmark) break;
          pPVar5 = ParseNode::AsParseNodeTri(this);
          SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Push
                    ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48,
                     &pPVar5->pnode1);
          SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Push
                    ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48,
                     &pPVar5->pnode2);
          SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Push
                    ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48,
                     &pPVar5->pnode3);
        }
        if ((this->nop != knopCall) && (this->nop != knopNew)) break;
        pPVar6 = ParseNode::AsParseNodeCall(this);
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Push
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48,
                   &pPVar6->pnodeTarget);
        pPVar6 = ParseNode::AsParseNodeCall(this);
        if (pPVar6->pnodeArgs != (ParseNodePtr)0x0) {
          pPVar6 = ParseNode::AsParseNodeCall(this);
          SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Push
                    ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48,
                     &pPVar6->pnodeArgs);
        }
      }
    } while (this->nop != knopList);
    pnode_local._4_4_ = 1;
LAB_00b2a8dd:
    SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::~SList
              ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_48);
  }
  else {
    pnode_local._4_4_ = 0;
  }
  return pnode_local._4_4_;
}

Assistant:

BOOL MayHaveSideEffectOnNode(ParseNode *pnode, ParseNode *pnodeSE, ByteCodeGenerator *byteCodeGenerator)
{
    // Try to determine whether pnodeSE (SE = side effect) may kill the named var represented by pnode.

    if (pnode->nop == knopComputedName)
    {
        pnode = pnode->AsParseNodeUni()->pnode1;
    }

    if (pnode->nop != knopName)
    {
        // Only investigating named vars here.
        return false;
    }

    ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
    SList<ParseNode*> pNodeSEStack(alloc);

    pNodeSEStack.Push(pnodeSE);

    // A pnodeSE can have children that can cause a side effect on pnode. A stack is used to check
    // pnodeSE and all potential pnodeSE children that could cause a side effect on pnode. When a
    // child pnodeSE can cause a side effect on pnode, immediately return true. Otherwise continue
    // checking children of pnodeSE until none exist
    while (!pNodeSEStack.Empty())
    {
        ParseNode *currPnodeSE = pNodeSEStack.Pop();
        uint fnop = ParseNode::Grfnop(currPnodeSE->nop);

        if (fnop & fnopLeaf)
        {
            // pnodeSE is a leaf and can't kill anything.
            continue;
        }
        else if (fnop & fnopAsg)
        {
            // pnodeSE is an assignment (=, ++, +=, etc.)
            // Trying to examine the LHS of pnodeSE caused small perf regressions,
            // maybe because of code layout or some other subtle effect.
            return true;
        }
        else if (fnop & fnopUni)
        {
            // pnodeSE is a unary op, so recurse to the source (if present - e.g., [] may have no opnd).
            if (currPnodeSE->nop == knopTempRef)
            {
                continue;
            }
            else if (currPnodeSE->AsParseNodeUni()->pnode1)
            {
                pNodeSEStack.Push(currPnodeSE->AsParseNodeUni()->pnode1);
            }
        }
        else if (fnop & fnopBin)
        {
            // currPnodeSE is a binary (or ternary) op, so check sources (if present).

            pNodeSEStack.Push(currPnodeSE->AsParseNodeBin()->pnode1);
            
            if (currPnodeSE->AsParseNodeBin()->pnode2)
            {
                pNodeSEStack.Push(currPnodeSE->AsParseNodeBin()->pnode2);
            }
        }
        else if (currPnodeSE->nop == knopQmark)
        {
            ParseNodeTri * pnodeTriSE = currPnodeSE->AsParseNodeTri();

            pNodeSEStack.Push(pnodeTriSE->pnode1);
            pNodeSEStack.Push(pnodeTriSE->pnode2);
            pNodeSEStack.Push(pnodeTriSE->pnode3);
        }
        else if (currPnodeSE->nop == knopCall || currPnodeSE->nop == knopNew)
        {
            pNodeSEStack.Push(currPnodeSE->AsParseNodeCall()->pnodeTarget);

            if (currPnodeSE->AsParseNodeCall()->pnodeArgs)
            {
                pNodeSEStack.Push(currPnodeSE->AsParseNodeCall()->pnodeArgs);
            }
        }
        else if (currPnodeSE->nop == knopList)
        {
            return true;
        }
    }

    return false;
}